

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAdES.h
# Opt level: O0

void __thiscall RDNSequence::Encode(RDNSequence *this,uchar *pOut,size_t cbOut,size_t *cbUsed)

{
  size_t sVar1;
  size_type sVar2;
  reference this_00;
  uchar *pOut_00;
  size_t *cbUsed_00;
  ulong local_60;
  size_t item;
  undefined1 local_48 [8];
  EncodeHelper eh;
  size_t *cbUsed_local;
  size_t cbOut_local;
  uchar *pOut_local;
  RDNSequence *this_local;
  
  eh.cbUsed = cbUsed;
  EncodeHelper::EncodeHelper((EncodeHelper *)local_48,cbUsed);
  sVar1 = DerBase::EncodedSize(&this->super_DerBase);
  EncodeHelper::Init((EncodeHelper *)local_48,sVar1,pOut,cbOut,'0',(this->super_DerBase).cbData);
  local_60 = 0;
  while( true ) {
    sVar2 = std::vector<RelativeDistinguishedName,_std::allocator<RelativeDistinguishedName>_>::size
                      (&this->name);
    if (sVar2 <= local_60) break;
    this_00 = std::vector<RelativeDistinguishedName,_std::allocator<RelativeDistinguishedName>_>::
              operator[](&this->name,local_60);
    pOut_00 = EncodeHelper::DataPtr((EncodeHelper *)local_48,pOut);
    sVar1 = EncodeHelper::DataSize((EncodeHelper *)local_48);
    cbUsed_00 = EncodeHelper::CurrentSize((EncodeHelper *)local_48);
    RelativeDistinguishedName::Encode(this_00,pOut_00,sVar1,cbUsed_00);
    EncodeHelper::Update((EncodeHelper *)local_48);
    local_60 = local_60 + 1;
  }
  EncodeHelper::Finalize((EncodeHelper *)local_48);
  EncodeHelper::~EncodeHelper((EncodeHelper *)local_48);
  return;
}

Assistant:

virtual void Encode(unsigned char* pOut, size_t cbOut, size_t& cbUsed) override
	{
        EncodeHelper eh(cbUsed);

        eh.Init(EncodedSize(), pOut, cbOut, static_cast<unsigned char>(DerType::ConstructedSequence), cbData);

        // This is a sequence of sets of AttributeTypeAndValue
        for (size_t item = 0; item < name.size(); ++item)
        {
            name[item].Encode(eh.DataPtr(pOut), eh.DataSize(), eh.CurrentSize());
            eh.Update();
        }

		eh.Finalize();
	}